

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_set_info_key(qpdf_data qpdf,char *key,char *value)

{
  QPDFObjectHandle *oh;
  bool bVar1;
  QPDFObjectHandle info;
  QPDFObjectHandle trailer;
  QPDFObjectHandle value_object;
  allocator<char> local_79;
  string local_78;
  QPDFObjectHandle local_58;
  undefined1 local_48 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((key != (char *)0x0) && (*key == '/')) {
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    if (value == (char *)0x0) {
      QPDFObjectHandle::newNull();
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10),
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,value,(allocator<char> *)&local_58);
      QPDFObjectHandle::newString((string *)local_48);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10),
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
      std::__cxx11::string::~string((string *)&local_78);
    }
    QPDF::getTrailer((QPDF *)local_48);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"/Info",(allocator<char> *)&local_58);
    bVar1 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_48,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/Info",&local_79);
      oh = (QPDFObjectHandle *)
           (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      QPDFObjectHandle::newDictionary();
      QPDF::makeIndirectObject((QPDF *)&local_58,oh);
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_48,&local_78,&local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
      std::__cxx11::string::~string((string *)&local_78);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"/Info",&local_79);
    QPDFObjectHandle::getKey(&local_58,(string *)local_48);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,key,&local_79);
    QPDFObjectHandle::replaceKey(&local_58,&local_78,(QPDFObjectHandle *)(local_48 + 0x10));
    std::__cxx11::string::~string((string *)&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x18));
  }
  return;
}

Assistant:

void
qpdf_set_info_key(qpdf_data qpdf, char const* key, char const* value)
{
    if ((key == nullptr) || (std::strlen(key) == 0) || (key[0] != '/')) {
        return;
    }
    QPDFObjectHandle value_object;
    if (value) {
        QTC::TC("qpdf", "qpdf-c set_info_key to value");
        value_object = QPDFObjectHandle::newString(value);
    } else {
        QTC::TC("qpdf", "qpdf-c set_info_key to null");
        value_object = QPDFObjectHandle::newNull();
    }

    QPDFObjectHandle trailer = qpdf->qpdf->getTrailer();
    if (!trailer.hasKey("/Info")) {
        QTC::TC("qpdf", "qpdf-c add info to trailer");
        trailer.replaceKey(
            "/Info", qpdf->qpdf->makeIndirectObject(QPDFObjectHandle::newDictionary()));
    } else {
        QTC::TC("qpdf", "qpdf-c set-info-key use existing info");
    }

    QPDFObjectHandle info = trailer.getKey("/Info");
    info.replaceKey(key, value_object);
}